

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b3cdf::ParserImpl::ParseExpList(ParserImpl *this)

{
  int iVar1;
  TokenDetail op;
  GCObject *pGVar2;
  ParserImpl *in_RSI;
  bool bVar3;
  long *local_80;
  Lexer *local_78;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_70;
  String *local_68;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> local_60;
  undefined8 local_58;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aStack_50;
  String *local_48;
  int iStack_40;
  int iStack_3c;
  
  local_60._M_head_impl = (SyntaxTree *)this;
  local_70.str_ = (String *)operator_new(0x28);
  local_68 = (String *)&in_RSI->look_ahead_;
  if ((in_RSI->look_ahead_).token_ == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,(TokenDetail *)local_68);
  }
  iVar1 = (in_RSI->look_ahead_).line_;
  ((local_70.str_)->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__ExpressionList_001895c8;
  pGVar2 = &(local_70.str_)->super_GCObject;
  ((local_70.str_)->super_GCObject).next_ = (GCObject *)0x0;
  *(undefined8 *)&((local_70.str_)->super_GCObject).field_0x10 = 0;
  ((local_70.str_)->field_1).str_ = (char *)0x0;
  *(int *)((long)&(local_70.str_)->field_1 + 8) = iVar1;
  bVar3 = true;
  do {
    local_80 = (long *)0x0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    aStack_50.number_ = 0.0;
    local_48 = (String *)0x0;
    iStack_40 = 0x11e;
    op._28_4_ = iStack_3c;
    op.token_ = 0x11e;
    op.line_ = 0;
    op.column_ = 0;
    op.field_0 = (anon_union_8_2_010d16d7_for_TokenDetail_0)0x0;
    op.module_ = (String *)0x0;
    ParseExp((ParserImpl *)&local_78,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)in_RSI,op,
             (int)&local_80);
    std::
    vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
    ::emplace_back<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>
              ((vector<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>,std::allocator<std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>>>
                *)&pGVar2->next_,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)&local_78);
    if (local_78 != (Lexer *)0x0) {
      (*(code *)(local_78->state_->string_pool_)._M_t.
                super___uniq_ptr_impl<luna::StringPool,_std::default_delete<luna::StringPool>_>._M_t
                .super__Tuple_impl<0UL,_luna::StringPool_*,_std::default_delete<luna::StringPool>_>.
                super__Head_base<0UL,_luna::StringPool_*,_false>._M_head_impl)();
    }
    local_78 = (Lexer *)0x0;
    if (local_80 != (long *)0x0) {
      (**(code **)(*local_80 + 8))();
    }
    local_80 = (long *)0x0;
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,(TokenDetail *)local_68);
    }
    if ((in_RSI->look_ahead_).token_ == 0x2c) {
      NextToken(in_RSI);
    }
    else {
      bVar3 = false;
    }
  } while (bVar3);
  (local_60._M_head_impl)->_vptr_SyntaxTree = (_func_int **)local_70;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         local_60._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseExpList()
        {
            std::unique_ptr<ExpressionList> exp_list(new ExpressionList(LookAhead().line_));

            bool anymore = true;
            while (anymore)
            {
                exp_list->exp_list_.push_back(ParseExp());

                if (LookAhead().token_ == ',')
                    NextToken();
                else
                    anymore = false;
            }

            return std::move(exp_list);
        }